

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_getrect(t_gobj *z,_glist *glist,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  
  iVar1 = text_xpix((t_text *)z,glist);
  *xp1 = iVar1;
  iVar1 = text_ypix((t_text *)z,glist);
  *yp1 = iVar1;
  iVar1 = *(int *)((long)&z[4].g_pd + 4);
  if (*(int *)&z[0x4a].g_next == 0) {
    *xp2 = iVar1 * *(int *)((long)&z[0x49].g_next + 4) + *xp1;
    iVar1 = *(int *)&z[4].g_pd;
  }
  else {
    *xp2 = iVar1 + *xp1;
    iVar1 = *(int *)((long)&z[0x49].g_next + 4) * *(int *)&z[4].g_pd;
  }
  *yp2 = iVar1 + *yp1;
  return;
}

Assistant:

static void radio_getrect(t_gobj *z, t_glist *glist, int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_radio *x = (t_radio *)z;

    *xp1 = text_xpix(&x->x_gui.x_obj, glist);
    *yp1 = text_ypix(&x->x_gui.x_obj, glist);
    if(x->x_orientation == horizontal)
    {
        *xp2 = *xp1 + x->x_gui.x_w * x->x_number;
        *yp2 = *yp1 + x->x_gui.x_h;
    } else {
        *xp2 = *xp1 + x->x_gui.x_w;
        *yp2 = *yp1 + x->x_gui.x_h * x->x_number;
    }
}